

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WjTestLib.c
# Opt level: O3

void WjTestLib_FreeTests(void)

{
  WjtlGroupList *pWVar1;
  WjtlTestList *pWVar2;
  WjtlTestList *__ptr;
  WjtlGroupList *__ptr_00;
  
  __ptr_00 = gGroupListHead;
  if (gGroupListHead != (WjtlGroupList *)0x0) {
    do {
      pWVar1 = __ptr_00->Next;
      __ptr = __ptr_00->TestListHead;
      while (__ptr != (WjtlTestList *)0x0) {
        pWVar2 = __ptr->Next;
        free(__ptr->TestName);
        free(__ptr);
        __ptr = pWVar2;
      }
      __ptr_00->TestListHead = (WjtlTestList *)0x0;
      __ptr_00->TestListTail = (WjtlTestList *)0x0;
      free(__ptr_00->GroupName);
      free(__ptr_00);
      __ptr_00 = pWVar1;
    } while (pWVar1 != (WjtlGroupList *)0x0);
  }
  gGroupListHead = (WjtlGroupList *)0x0;
  gGroupListTail = (WjtlGroupList *)0x0;
  return;
}

Assistant:

void
    WjTestLib_FreeTests
    (
        void
    )
{
    WjtlGroupList* nextGroup = NULL;
    for( WjtlGroupList* group=gGroupListHead; group!=NULL; group=nextGroup )
    {
        nextGroup = group->Next;

        WjtlTestList* nextTest = NULL;
        for( WjtlTestList* test=group->TestListHead; test!=NULL; test=nextTest )
        {
            nextTest = test->Next;

            free( test->TestName );
            test->TestName = NULL;
            free( test );
            test = NULL;
        }

        group->TestListHead = NULL;
        group->TestListTail = NULL;

        free( group->GroupName );
        group->GroupName = NULL;
        free( group );
        group = NULL;
    }

    gGroupListHead = NULL;
    gGroupListTail = NULL;
}